

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O0

void obj_moveinletfirst(t_object *x,_inlet *i)

{
  _inlet *local_20;
  _inlet *i2;
  _inlet *i_local;
  t_object *x_local;
  
  if (x->te_inlet != i) {
    for (local_20 = x->te_inlet; local_20 != (_inlet *)0x0; local_20 = local_20->i_next) {
      if (local_20->i_next == i) {
        local_20->i_next = i->i_next;
        i->i_next = x->te_inlet;
        x->te_inlet = i;
        return;
      }
    }
  }
  return;
}

Assistant:

void obj_moveinletfirst(t_object *x, t_inlet *i)
{
    t_inlet *i2;
    if (x->ob_inlet == i) return;
    else for (i2 = x->ob_inlet; i2; i2 = i2->i_next)
        if (i2->i_next == i)
    {
        i2->i_next = i->i_next;
        i->i_next = x->ob_inlet;
        x->ob_inlet = i;
        return;
    }
}